

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

bool __thiscall cmCacheManager::SaveCache(cmCacheManager *this,string *path)

{
  CacheEntryType type;
  int iVar1;
  pointer pcVar2;
  uint uVar3;
  ostream *poVar4;
  string *psVar5;
  char *pcVar6;
  size_t sVar7;
  cmCacheManager *pcVar8;
  cmCacheManager *pcVar9;
  iterator iVar10;
  bool bVar11;
  CacheIterator i;
  string currentcwd;
  string checkCacheFile;
  string cacheFile;
  ofstream checkCache;
  cmGeneratedFileStream fout;
  char temp [1024];
  cmCacheManager *local_8f8;
  cmCacheManager *local_8f0;
  string local_8e8;
  long *local_8c8 [2];
  long local_8b8 [2];
  long *local_8a8 [2];
  long local_898 [2];
  string *local_888;
  undefined1 local_880 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_870;
  byte abStack_860 [216];
  ios_base local_788 [264];
  undefined1 local_680 [584];
  char local_438 [1032];
  
  local_8a8[0] = local_898;
  pcVar2 = (path->_M_dataplus)._M_p;
  local_8f8 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_8a8,pcVar2,pcVar2 + path->_M_string_length);
  std::__cxx11::string::append((char *)local_8a8);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_680,(char *)local_8a8[0],false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_680,true);
  if (((byte)(*(_func_int **)(local_680._0_8_ + -0x18))[(long)(local_680 + 0x20)] & 5) == 0) {
    uVar3 = cmVersion::GetMinorVersion();
    sprintf(local_438,"%d",(ulong)uVar3);
    local_880._0_8_ = &local_870;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_880,"CMAKE_CACHE_MINOR_VERSION","");
    AddCacheEntry(local_8f8,(string *)local_880,local_438,
                  "Minor version of cmake used to create the current loaded cache",INTERNAL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._0_8_ != &local_870) {
      operator_delete((void *)local_880._0_8_,local_870._M_allocated_capacity + 1);
    }
    uVar3 = cmVersion::GetMajorVersion();
    sprintf(local_438,"%d",(ulong)uVar3);
    local_880._0_8_ = &local_870;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_880,"CMAKE_CACHE_MAJOR_VERSION","");
    AddCacheEntry(local_8f8,(string *)local_880,local_438,
                  "Major version of cmake used to create the current loaded cache",INTERNAL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._0_8_ != &local_870) {
      operator_delete((void *)local_880._0_8_,local_870._M_allocated_capacity + 1);
    }
    uVar3 = cmVersion::GetPatchVersion();
    sprintf(local_438,"%d",(ulong)uVar3);
    local_880._0_8_ = &local_870;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_880,"CMAKE_CACHE_PATCH_VERSION","");
    AddCacheEntry(local_8f8,(string *)local_880,local_438,
                  "Patch version of cmake used to create the current loaded cache",INTERNAL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._0_8_ != &local_870) {
      operator_delete((void *)local_880._0_8_,local_870._M_allocated_capacity + 1);
    }
    local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
    pcVar2 = (path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8e8,pcVar2,pcVar2 + path->_M_string_length);
    if (((byte)(*local_8e8._M_dataplus._M_p + 0xbfU) < 0x1a) &&
       (local_8e8._M_dataplus._M_p[1] == 0x3a)) {
      *local_8e8._M_dataplus._M_p = *local_8e8._M_dataplus._M_p | 0x20;
    }
    local_888 = path;
    cmsys::SystemTools::ConvertToUnixSlashes(&local_8e8);
    local_880._0_8_ = &local_870;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_880,"CMAKE_CACHEFILE_DIR","");
    AddCacheEntry(local_8f8,(string *)local_880,local_8e8._M_dataplus._M_p,
                  "This is the directory where this CMakeCache.txt was created",INTERNAL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._0_8_ != &local_870) {
      operator_delete((void *)local_880._0_8_,local_870._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_680,"# This is the CMakeCache file.\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_680,"# For build in directory: ",0x1a);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_680,local_8e8._M_dataplus._M_p,local_8e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"# It was generated by CMake: ",0x1d);
    psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_680,
               "# You can edit this file to change values found and used by cmake.",0x42);
    std::ios::widen((char)(ostream *)local_680 + (char)*(_func_int **)(local_680._0_8_ + -0x18));
    std::ostream::put((char)local_680);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"# If you do not want to change any of the values, simply exit the editor.",
               0x49);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"# If you do want to change a value, simply edit, save, and exit the editor.",
               0x4b);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"# The syntax for the file is as follows:\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"# KEY:TYPE=VALUE\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"# KEY is the name of a variable in the cache.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT TYPE!.",0x42);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"# VALUE is the current value for the KEY.\n\n",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_680,"########################\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_680,"# EXTERNAL cache entries\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_680,"########################\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_680,"\n",1);
    pcVar8 = (cmCacheManager *)
             (local_8f8->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_8f0 = (cmCacheManager *)&(local_8f8->Cache)._M_t._M_impl.super__Rb_tree_header;
    if (pcVar8 != local_8f0) {
      do {
        type = *(CacheEntryType *)
                &pcVar8[1].Cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if ((type != INTERNAL &
            *(byte *)&pcVar8[2].Cache._M_t._M_impl.super__Rb_tree_header._M_header._M_color) == 1) {
          local_880._0_8_ = &local_870;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_880,"HELPSTRING","");
          pcVar6 = CacheEntry::GetProperty((CacheEntry *)(pcVar8 + 1),(string *)local_880);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_880._0_8_ != &local_870) {
            operator_delete((void *)local_880._0_8_,local_870._M_allocated_capacity + 1);
          }
          local_880._0_8_ = &local_870;
          if (pcVar6 == (char *)0x0) {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_880,"Missing description","");
            OutputHelpString((ostream *)local_680,(string *)local_880);
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_880,pcVar6,pcVar6 + sVar7);
            OutputHelpString((ostream *)local_680,(string *)local_880);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_880._0_8_ != &local_870) {
            operator_delete((void *)local_880._0_8_,local_870._M_allocated_capacity + 1);
          }
          OutputKey((ostream *)local_680,
                    (string *)
                    &(pcVar8->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_680,":",1);
          pcVar6 = cmState::CacheEntryTypeToString(type);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)&local_8f8 + (int)*(_func_int **)(local_680._0_8_ + -0x18) + 0x278)
            ;
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_680,pcVar6,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_680,"=",1);
          OutputValue((ostream *)local_680,(string *)(pcVar8 + 1));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_680,"\n\n",2);
        }
        pcVar8 = (cmCacheManager *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar8);
      } while (pcVar8 != local_8f0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_680,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_680,"########################\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_680,"# INTERNAL cache entries\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_680,"########################\n",0x19);
    pcVar8 = (cmCacheManager *)local_680;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar8,"\n",1);
    iVar10._M_node = (local_8f8->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((cmCacheManager *)iVar10._M_node != local_8f0) {
      do {
        if ((char)(((cmCacheManager *)(iVar10._M_node + 4))->Cache)._M_t._M_impl.
                  super__Rb_tree_header._M_header._M_color == _S_black) {
          iVar1 = iVar10._M_node[3]._M_color;
          i.Position._M_node = iVar10._M_node;
          i.Container = local_8f8;
          WritePropertyEntries(pcVar8,(ostream *)local_680,i);
          if (iVar1 == 4) {
            local_880._0_8_ = &local_870;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_880,"HELPSTRING","");
            pcVar6 = CacheEntry::GetProperty((CacheEntry *)(iVar10._M_node + 2),(string *)local_880)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_880._0_8_ != &local_870) {
              operator_delete((void *)local_880._0_8_,local_870._M_allocated_capacity + 1);
            }
            if (pcVar6 != (char *)0x0) {
              local_880._0_8_ = &local_870;
              sVar7 = strlen(pcVar6);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_880,pcVar6,pcVar6 + sVar7);
              OutputHelpString((ostream *)local_680,(string *)local_880);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_880._0_8_ != &local_870) {
                operator_delete((void *)local_880._0_8_,local_870._M_allocated_capacity + 1);
              }
            }
            local_880._0_8_ = &local_870;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_880,*(_Base_ptr *)(iVar10._M_node + 1),
                       (long)&(*(_Base_ptr *)(iVar10._M_node + 1))->_M_color +
                       (long)&(iVar10._M_node[1]._M_parent)->_M_color);
            OutputKey((ostream *)local_680,(string *)local_880);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_880._0_8_ != &local_870) {
              operator_delete((void *)local_880._0_8_,local_870._M_allocated_capacity + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_680,":",1);
            pcVar6 = cmState::CacheEntryTypeToString(INTERNAL);
            if (pcVar6 == (char *)0x0) {
              std::ios::clear((int)&local_8f8 + (int)*(_func_int **)(local_680._0_8_ + -0x18) +
                              0x278);
            }
            else {
              sVar7 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_680,pcVar6,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_680,"=",1);
            std::__cxx11::string::string
                      ((string *)local_880,
                       (((CacheEntry *)(iVar10._M_node + 2))->Value)._M_dataplus._M_p,
                       (allocator *)local_8c8);
            OutputValue((ostream *)local_680,(string *)local_880);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_880._0_8_ != &local_870) {
              operator_delete((void *)local_880._0_8_,local_870._M_allocated_capacity + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_680,"\n",1);
          }
        }
        pcVar9 = (cmCacheManager *)std::_Rb_tree_increment(iVar10._M_node);
        pcVar8 = (cmCacheManager *)iVar10._M_node;
        iVar10._M_node = (_Base_ptr)pcVar9;
      } while (pcVar9 != local_8f0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_680,"\n",1);
    cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_680);
    pcVar2 = (local_888->_M_dataplus)._M_p;
    local_8c8[0] = local_8b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_8c8,pcVar2,pcVar2 + local_888->_M_string_length);
    std::__cxx11::string::append((char *)local_8c8);
    cmsys::SystemTools::MakeDirectory((char *)local_8c8[0]);
    std::__cxx11::string::append((char *)local_8c8);
    std::ofstream::ofstream(local_880,(char *)local_8c8[0],_S_out);
    bVar11 = (abStack_860[*(long *)(local_880._0_8_ + -0x18)] & 5) == 0;
    if (bVar11) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_880,
                 "# This file is generated by cmake for dependency checking of the CMakeCache.txt file\n"
                 ,0x55);
    }
    else {
      cmSystemTools::Error
                ("Unable to open check cache file for write. ",(char *)local_8c8[0],(char *)0x0,
                 (char *)0x0);
    }
    local_880._0_8_ = _VTT;
    *(undefined8 *)(local_880 + *(long *)(_VTT + -0x18)) = _vtable;
    std::filebuf::~filebuf((filebuf *)(local_880 + 8));
    std::ios_base::~ios_base(local_788);
    if (local_8c8[0] != local_8b8) {
      operator_delete(local_8c8[0],local_8b8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
      operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    cmSystemTools::Error
              ("Unable to open cache file for save. ",(char *)local_8a8[0],(char *)0x0,(char *)0x0);
    cmSystemTools::ReportLastSystemError("");
    bVar11 = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_680);
  if (local_8a8[0] != local_898) {
    operator_delete(local_8a8[0],local_898[0] + 1);
  }
  return bVar11;
}

Assistant:

bool cmCacheManager::SaveCache(const std::string& path)
{
  std::string cacheFile = path;
  cacheFile += "/CMakeCache.txt";
  cmGeneratedFileStream fout(cacheFile.c_str());
  fout.SetCopyIfDifferent(true);
  if (!fout) {
    cmSystemTools::Error("Unable to open cache file for save. ",
                         cacheFile.c_str());
    cmSystemTools::ReportLastSystemError("");
    return false;
  }
  // before writing the cache, update the version numbers
  // to the
  char temp[1024];
  sprintf(temp, "%d", cmVersion::GetMinorVersion());
  this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION", temp,
                      "Minor version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);
  sprintf(temp, "%d", cmVersion::GetMajorVersion());
  this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION", temp,
                      "Major version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);
  sprintf(temp, "%d", cmVersion::GetPatchVersion());
  this->AddCacheEntry("CMAKE_CACHE_PATCH_VERSION", temp,
                      "Patch version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);

  // Let us store the current working directory so that if somebody
  // Copies it, he will not be surprised
  std::string currentcwd = path;
  if (currentcwd[0] >= 'A' && currentcwd[0] <= 'Z' && currentcwd[1] == ':') {
    // Cast added to avoid compiler warning. Cast is ok because
    // value is guaranteed to fit in char by the above if...
    currentcwd[0] = static_cast<char>(currentcwd[0] - 'A' + 'a');
  }
  cmSystemTools::ConvertToUnixSlashes(currentcwd);
  this->AddCacheEntry("CMAKE_CACHEFILE_DIR", currentcwd.c_str(),
                      "This is the directory where this CMakeCache.txt"
                      " was created",
                      cmStateEnums::INTERNAL);

  /* clang-format off */
  fout << "# This is the CMakeCache file.\n"
       << "# For build in directory: " << currentcwd << "\n"
       << "# It was generated by CMake: "
       << cmSystemTools::GetCMakeCommand() << std::endl;
  /* clang-format on */

  /* clang-format off */
  fout << "# You can edit this file to change values found and used by cmake."
       << std::endl
       << "# If you do not want to change any of the values, simply exit the "
       "editor." << std::endl
       << "# If you do want to change a value, simply edit, save, and exit "
       "the editor." << std::endl
       << "# The syntax for the file is as follows:\n"
       << "# KEY:TYPE=VALUE\n"
       << "# KEY is the name of a variable in the cache.\n"
       << "# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT "
       "TYPE!." << std::endl
       << "# VALUE is the current value for the KEY.\n\n";
  /* clang-format on */

  fout << "########################\n";
  fout << "# EXTERNAL cache entries\n";
  fout << "########################\n";
  fout << "\n";

  for (std::map<std::string, CacheEntry>::const_iterator i =
         this->Cache.begin();
       i != this->Cache.end(); ++i) {
    const CacheEntry& ce = (*i).second;
    cmStateEnums::CacheEntryType t = ce.Type;
    if (!ce.Initialized) {
      /*
        // This should be added in, but is not for now.
      cmSystemTools::Error("Cache entry \"", (*i).first.c_str(),
                           "\" is uninitialized");
      */
    } else if (t != cmStateEnums::INTERNAL) {
      // Format is key:type=value
      if (const char* help = ce.GetProperty("HELPSTRING")) {
        cmCacheManager::OutputHelpString(fout, help);
      } else {
        cmCacheManager::OutputHelpString(fout, "Missing description");
      }
      this->OutputKey(fout, i->first);
      fout << ":" << cmState::CacheEntryTypeToString(t) << "=";
      this->OutputValue(fout, ce.Value);
      fout << "\n\n";
    }
  }

  fout << "\n";
  fout << "########################\n";
  fout << "# INTERNAL cache entries\n";
  fout << "########################\n";
  fout << "\n";

  for (cmCacheManager::CacheIterator i = this->NewIterator(); !i.IsAtEnd();
       i.Next()) {
    if (!i.Initialized()) {
      continue;
    }

    cmStateEnums::CacheEntryType t = i.GetType();
    this->WritePropertyEntries(fout, i);
    if (t == cmStateEnums::INTERNAL) {
      // Format is key:type=value
      if (const char* help = i.GetProperty("HELPSTRING")) {
        this->OutputHelpString(fout, help);
      }
      this->OutputKey(fout, i.GetName());
      fout << ":" << cmState::CacheEntryTypeToString(t) << "=";
      this->OutputValue(fout, i.GetValue());
      fout << "\n";
    }
  }
  fout << "\n";
  fout.Close();
  std::string checkCacheFile = path;
  checkCacheFile += cmake::GetCMakeFilesDirectory();
  cmSystemTools::MakeDirectory(checkCacheFile.c_str());
  checkCacheFile += "/cmake.check_cache";
  cmsys::ofstream checkCache(checkCacheFile.c_str());
  if (!checkCache) {
    cmSystemTools::Error("Unable to open check cache file for write. ",
                         checkCacheFile.c_str());
    return false;
  }
  checkCache << "# This file is generated by cmake for dependency checking "
                "of the CMakeCache.txt file\n";
  return true;
}